

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linetype.cpp
# Opt level: O0

bool __thiscall
ON_Linetype::SetTaper(ON_Linetype *this,double startWidth,ON_2dPoint taperPoint,double endWidth)

{
  ON_LinetypePrivate *pOVar1;
  bool bVar2;
  ON_2dPoint local_58;
  ON_2dPoint local_48;
  double local_38;
  double endWidth_local;
  double startWidth_local;
  ON_Linetype *this_local;
  ON_2dPoint taperPoint_local;
  
  taperPoint_local.x = taperPoint.y;
  this_local = (ON_Linetype *)taperPoint.x;
  if ((startWidth < 0.0) || (endWidth < 0.0)) {
    taperPoint_local.y._7_1_ = false;
  }
  else {
    local_38 = endWidth;
    endWidth_local = startWidth;
    startWidth_local = (double)this;
    bVar2 = ON_2dPoint::IsValid((ON_2dPoint *)&this_local);
    if (bVar2) {
      if (((double)this_local < 0.0) || (1.0 < (double)this_local)) {
        taperPoint_local.y._7_1_ = false;
      }
      else if (0.0 <= taperPoint_local.x) {
        ON_SimpleArray<ON_2dPoint>::Empty(&this->m_private->m_taper_points);
        pOVar1 = this->m_private;
        ON_2dPoint::ON_2dPoint(&local_48,0.0,endWidth_local);
        ON_SimpleArray<ON_2dPoint>::Append(&pOVar1->m_taper_points,&local_48);
        ON_SimpleArray<ON_2dPoint>::Append
                  (&this->m_private->m_taper_points,(ON_2dPoint *)&this_local);
        pOVar1 = this->m_private;
        ON_2dPoint::ON_2dPoint(&local_58,1.0,local_38);
        ON_SimpleArray<ON_2dPoint>::Append(&pOVar1->m_taper_points,&local_58);
        taperPoint_local.y._7_1_ = true;
      }
      else {
        taperPoint_local.y._7_1_ = false;
      }
    }
    else {
      taperPoint_local.y._7_1_ = false;
    }
  }
  return taperPoint_local.y._7_1_;
}

Assistant:

bool ON_Linetype::SetTaper(double startWidth, ON_2dPoint taperPoint, double endWidth)
{
  if (startWidth < 0 || endWidth < 0)
    return false;

  if (!taperPoint.IsValid())
    return false;
  if (taperPoint.x < 0.0 || taperPoint.x > 1.0)
    return false;
  if (taperPoint.y < 0.0)
    return false;

  m_private->m_taper_points.Empty();
  m_private->m_taper_points.Append(ON_2dPoint(0, startWidth));
  m_private->m_taper_points.Append(taperPoint);
  m_private->m_taper_points.Append(ON_2dPoint(1.0, endWidth));
  return true;
}